

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O1

shared_ptr<CBlock> __thiscall
validation_block_tests::MinerTestingSetup::FinalizeBlock
          (MinerTestingSetup *this,shared_ptr<CBlock> pblock)

{
  uint32_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  _func_int **pp_Var5;
  CBlockHeader *this_00;
  undefined8 uVar6;
  uint256 hash;
  uint256 hash_00;
  bool bVar7;
  CBlockIndex *pindexPrev;
  CChainParams *pCVar8;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  iterator in_R8;
  iterator in_R9;
  pointer *val;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar11;
  const_string file;
  span<const_CBlockHeader,_18446744073709551615UL> headers;
  const_string msg;
  CBlockHeader block;
  BlockValidationState ignored;
  check_type cVar12;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  char **local_150;
  assertion_result local_148;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  CBlockHeader local_f8;
  ValidationState<BlockValidationResult> local_a0;
  uint256 local_58;
  long local_38;
  
  _Var10 = pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.nVersion = 0x13bf540;
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_ =
       local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_ & 0xffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_f8);
  pindexPrev = ::node::BlockManager::LookupBlockIndex
                         ((BlockManager *)
                          &((pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[0x7f].
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(uint256 *)((long)(_Var10._M_pi)->_vptr__Sp_counted_base + 4)
                         );
  val = &((pblock.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_f8);
  ChainstateManager::GenerateCoinbaseCommitment
            (&local_110,(ChainstateManager *)*val,(CBlock *)(_Var10._M_pi)->_vptr__Sp_counted_base,
             pindexPrev);
  if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BlockMerkleRoot((uint256 *)&local_f8,(CBlock *)(_Var10._M_pi)->_vptr__Sp_counted_base,(bool *)0x0)
  ;
  pp_Var5 = (_Var10._M_pi)->_vptr__Sp_counted_base;
  *(ulong *)((long)pp_Var5 + 0x34) =
       CONCAT44(local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_,
                local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_);
  *(ulong *)((long)pp_Var5 + 0x3c) =
       CONCAT44(local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_,
                local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_);
  *(ulong *)((long)pp_Var5 + 0x24) =
       CONCAT44(local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_4_,local_f8.nVersion
               );
  *(ulong *)((long)pp_Var5 + 0x2c) =
       CONCAT44(local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_,
                local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_);
  CBlockHeader::GetHash(&local_58,(CBlockHeader *)(_Var10._M_pi)->_vptr__Sp_counted_base);
  uVar4 = *(uint *)((_Var10._M_pi)->_vptr__Sp_counted_base + 9);
  pCVar8 = Params();
  hash.super_base_blob<256U>.m_data._M_elems[8] = local_58.super_base_blob<256U>.m_data._M_elems[8];
  hash.super_base_blob<256U>.m_data._M_elems[9] = local_58.super_base_blob<256U>.m_data._M_elems[9];
  hash.super_base_blob<256U>.m_data._M_elems[10] =
       local_58.super_base_blob<256U>.m_data._M_elems[10];
  hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xb];
  hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xc];
  hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xd];
  hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xe];
  hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_58.super_base_blob<256U>.m_data._M_elems[0xf];
  hash.super_base_blob<256U>.m_data._M_elems[0] = local_58.super_base_blob<256U>.m_data._M_elems[0];
  hash.super_base_blob<256U>.m_data._M_elems[1] = local_58.super_base_blob<256U>.m_data._M_elems[1];
  hash.super_base_blob<256U>.m_data._M_elems[2] = local_58.super_base_blob<256U>.m_data._M_elems[2];
  hash.super_base_blob<256U>.m_data._M_elems[3] = local_58.super_base_blob<256U>.m_data._M_elems[3];
  hash.super_base_blob<256U>.m_data._M_elems[4] = local_58.super_base_blob<256U>.m_data._M_elems[4];
  hash.super_base_blob<256U>.m_data._M_elems[5] = local_58.super_base_blob<256U>.m_data._M_elems[5];
  hash.super_base_blob<256U>.m_data._M_elems[6] = local_58.super_base_blob<256U>.m_data._M_elems[6];
  hash.super_base_blob<256U>.m_data._M_elems[7] = local_58.super_base_blob<256U>.m_data._M_elems[7];
  hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x10];
  hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x11];
  hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x12];
  hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x13];
  hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x14];
  hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x15];
  hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x16];
  hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x17];
  hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x18];
  hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x19];
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
  _cVar12 = (check_type)local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
  bVar7 = CheckProofOfWork(hash,uVar4,&pCVar8->consensus);
  if (!bVar7) {
    do {
      this_00 = (CBlockHeader *)(_Var10._M_pi)->_vptr__Sp_counted_base;
      puVar1 = &this_00->nNonce;
      *puVar1 = *puVar1 + 1;
      CBlockHeader::GetHash(&local_58,this_00);
      uVar4 = *(uint *)((_Var10._M_pi)->_vptr__Sp_counted_base + 9);
      pCVar8 = Params();
      hash_00.super_base_blob<256U>.m_data._M_elems[8] =
           local_58.super_base_blob<256U>.m_data._M_elems[8];
      hash_00.super_base_blob<256U>.m_data._M_elems[9] =
           local_58.super_base_blob<256U>.m_data._M_elems[9];
      hash_00.super_base_blob<256U>.m_data._M_elems[10] =
           local_58.super_base_blob<256U>.m_data._M_elems[10];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xb];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xc];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xd];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xe];
      hash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_58.super_base_blob<256U>.m_data._M_elems[0xf];
      hash_00.super_base_blob<256U>.m_data._M_elems[0] =
           local_58.super_base_blob<256U>.m_data._M_elems[0];
      hash_00.super_base_blob<256U>.m_data._M_elems[1] =
           local_58.super_base_blob<256U>.m_data._M_elems[1];
      hash_00.super_base_blob<256U>.m_data._M_elems[2] =
           local_58.super_base_blob<256U>.m_data._M_elems[2];
      hash_00.super_base_blob<256U>.m_data._M_elems[3] =
           local_58.super_base_blob<256U>.m_data._M_elems[3];
      hash_00.super_base_blob<256U>.m_data._M_elems[4] =
           local_58.super_base_blob<256U>.m_data._M_elems[4];
      hash_00.super_base_blob<256U>.m_data._M_elems[5] =
           local_58.super_base_blob<256U>.m_data._M_elems[5];
      hash_00.super_base_blob<256U>.m_data._M_elems[6] =
           local_58.super_base_blob<256U>.m_data._M_elems[6];
      hash_00.super_base_blob<256U>.m_data._M_elems[7] =
           local_58.super_base_blob<256U>.m_data._M_elems[7];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x10];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x11];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x12];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x13];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x14];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x15];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x16];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x17];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x18];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x19];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1a];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1b];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1c];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1d];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1e];
      hash_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_58.super_base_blob<256U>.m_data._M_elems[0x1f];
      _cVar12 = (check_type)local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
      bVar7 = CheckProofOfWork(hash_00,uVar4,&pCVar8->consensus);
    } while (!bVar7);
  }
  paVar2 = &local_a0.m_reject_reason.field_2;
  local_a0.m_mode = M_VALID;
  local_a0.m_result = BLOCK_RESULT_UNSET;
  local_a0.m_reject_reason._M_string_length = 0;
  local_a0.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_a0.m_debug_message.field_2;
  local_a0.m_debug_message._M_string_length = 0;
  local_a0.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = &DAT_00000068;
  file.m_begin = (iterator)&local_120;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_a0.m_reject_reason._M_dataplus._M_p = (pointer)paVar2;
  local_a0.m_debug_message._M_dataplus._M_p = (pointer)paVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
  puVar9 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)val,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_block_tests.cpp"
                      ,0x68,"FinalizeBlock","m_node.chainman");
  pp_Var5 = (_Var10._M_pi)->_vptr__Sp_counted_base;
  local_f8.nVersion = *(int32_t *)pp_Var5;
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0x14),0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0x14) >> 0x20,0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0x1c),0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._28_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0x1c) >> 0x20,0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 4),0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 4) >> 0x20,0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0xc),0);
  local_f8.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0xc) >> 0x20,0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0x24),0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._4_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0x24) >> 0x20,0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0x2c),0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0x2c) >> 0x20,0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0x34),0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._20_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0x34) >> 0x20,0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_4_ =
       SUB84(*(undefined8 *)((long)pp_Var5 + 0x3c),0);
  local_f8.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._28_4_ =
       SUB84((ulong)*(undefined8 *)((long)pp_Var5 + 0x3c) >> 0x20,0);
  local_f8.nTime = (uint32_t)*(undefined8 *)((long)pp_Var5 + 0x44);
  local_f8.nBits = (uint32_t)((ulong)*(undefined8 *)((long)pp_Var5 + 0x44) >> 0x20);
  local_f8.nNonce = *(uint32_t *)((long)pp_Var5 + 0x4c);
  headers._M_extent._M_extent_value = 1;
  headers._M_ptr = &local_f8;
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ChainstateManager::ProcessNewBlockHeaders
                 ((puVar9->_M_t).
                  super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                  .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,headers,true,
                  (BlockValidationState *)&local_a0,(CBlockIndex **)0x0);
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = &local_178;
  local_178 = 
  "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_block_tests.cpp\", 104, __func__, \"m_node.chainman\")->ProcessNewBlockHeaders({{pblock->GetBlockHeader()}}, true, ignored)"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_180 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_168,1,0,WARN,_cVar12,(size_t)&local_188,0x68);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  *(undefined8 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt.m_pipe_w = 0;
  uVar6 = *(undefined8 *)&(_Var10._M_pi)->_M_use_count;
  (_Var10._M_pi)->_M_use_count = 0;
  (_Var10._M_pi)->_M_weak_count = 0;
  *(_func_int ***)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt = (_Var10._M_pi)->_vptr__Sp_counted_base;
  *(undefined8 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .m_interrupt.m_pipe_w = uVar6;
  (_Var10._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  _Var10._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_debug_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_a0.m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_a0.m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_a0.m_debug_message.field_2._M_local_buf[0]) + 1);
    _Var10._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_reject_reason._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_a0.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_a0.m_reject_reason.field_2._M_local_buf[0]) + 1);
    _Var10._M_pi = extraout_RDX_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar11.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var10._M_pi;
    sVar11.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<CBlock>)sVar11.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CBlock> MinerTestingSetup::FinalizeBlock(std::shared_ptr<CBlock> pblock)
{
    const CBlockIndex* prev_block{WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(pblock->hashPrevBlock))};
    m_node.chainman->GenerateCoinbaseCommitment(*pblock, prev_block);

    pblock->hashMerkleRoot = BlockMerkleRoot(*pblock);

    while (!CheckProofOfWork(pblock->GetHash(), pblock->nBits, Params().GetConsensus())) {
        ++(pblock->nNonce);
    }

    // submit block header, so that miner can get the block height from the
    // global state and the node has the topology of the chain
    BlockValidationState ignored;
    BOOST_CHECK(Assert(m_node.chainman)->ProcessNewBlockHeaders({{pblock->GetBlockHeader()}}, true, ignored));

    return pblock;
}